

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddPoint
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          double radius,ChVector<double> *pos)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChCollisionShapeBullet *this_00;
  cbtConvexInternalShape *this_01;
  float fVar3;
  undefined1 auVar4 [16];
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  double local_70;
  ChMatrix33<double> local_68;
  
  local_70 = radius;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])();
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  fVar3 = *(float *)&(material->
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
  uStack_84 = *(undefined4 *)
               ((long)&(material->
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + 4);
  uStack_80 = *(undefined4 *)
               &(material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
  uStack_7c = *(undefined4 *)
               ((long)&(material->
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi + 4);
  p_Var2 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_88 = fVar3;
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,POINT,(shared_ptr<chrono::ChMaterialSurface> *)&local_88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80));
  }
  this_01 = (cbtConvexInternalShape *)cbtAlignedAllocInternal(0x48,0x10);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  cbtConvexInternalShape::cbtConvexInternalShape(this_01);
  auVar4._8_4_ = 0x3f800000;
  auVar4._0_8_ = 0x3f8000003f800000;
  auVar4._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar4);
  *(undefined8 *)&(this_01->super_cbtConvexShape).super_cbtCollisionShape.field_0x1c = uVar1;
  *(undefined4 *)&this_01->field_0x24 = 0x3f800000;
  (this_01->m_implicitShapeDimensions).m_floats[3] = 0.0;
  *(undefined8 *)&this_01->field_0x28 = 0;
  (this_01->m_implicitShapeDimensions).m_floats[1] = 0.0;
  (this_01->m_implicitShapeDimensions).m_floats[2] = 0.0;
  (this_01->m_implicitShapeDimensions).m_floats[0] = (float)((double)fVar3 + local_70);
  this_01->m_collisionMargin = (float)((double)fVar3 + local_70);
  this_01->m_padding = 0.0;
  (this_01->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtConvexShape_00b3c130;
  (this_01->super_cbtConvexShape).super_cbtCollisionShape.m_shapeType = 0x16;
  this_00->m_bt_shape = (cbtCollisionShape *)this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*(this_01->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xb])(this_01);
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  injectShape(this,pos,&local_68,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddPoint(std::shared_ptr<ChMaterialSurface> material,
                                      double radius,
                                      const ChVector<>& pos) {
    // adjust default inward 'safe' margin (always as radius)
    SetSafeMargin(radius);

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::POINT, material);

    shape->m_bt_shape = new cbtPointShape((cbtScalar)(radius + GetEnvelope()));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, ChMatrix33<>(1), shape);
    return true;
}